

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxFunctionCall::FxFunctionCall
          (FxFunctionCall *this,FName *methodname,FName *rngname,FArgumentList *args,
          FScriptPosition *pos)

{
  int iVar1;
  FRandom *pFVar2;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_FunctionCall,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxFunctionCall_00706a98;
  (this->MethodName).Index = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  (this->MethodName).Index = methodname->Index;
  this->RNG = &pr_exrandom;
  TArray<FxExpression_*,_FxExpression_*>::operator=
            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
             &args->super_TArray<FxExpression_*,_FxExpression_*>);
  if ((long)rngname->Index != 0) {
    iVar1 = (this->MethodName).Index;
    if (iVar1 - 0xd1U < 5) {
      pFVar2 = FRandom::StaticFindRNG(FName::NameData.NameArray[rngname->Index].Text);
      this->RNG = pFVar2;
    }
    else {
      FScriptPosition::Message
                (pos,2,"Cannot use named RNGs with %s",FName::NameData.NameArray[iVar1].Text);
    }
  }
  return;
}

Assistant:

FxFunctionCall::FxFunctionCall(FName methodname, FName rngname, FArgumentList &args, const FScriptPosition &pos)
: FxExpression(EFX_FunctionCall, pos)
{
	MethodName = methodname;
	RNG = &pr_exrandom;
	ArgList = std::move(args);
	if (rngname != NAME_None)
	{
		switch (MethodName)
		{
		case NAME_Random:
		case NAME_FRandom:
		case NAME_RandomPick:
		case NAME_FRandomPick:
		case NAME_Random2:
			RNG = FRandom::StaticFindRNG(rngname.GetChars());
			break;

		default:
			pos.Message(MSG_ERROR, "Cannot use named RNGs with %s", MethodName.GetChars());
			break;

		}
	}
}